

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>
fmt::v8::detail::
format_uint<4u,char32_t,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,unsigned__int128>
          (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> out,unsigned___int128 value,
          int num_digits,bool upper)

{
  undefined1 value_00 [16];
  undefined1 value_01 [16];
  type tVar1;
  detail *this;
  int in_ECX;
  int num_digits_00;
  undefined7 in_register_00000011;
  undefined4 in_register_00000034;
  undefined8 in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  detail local_98 [8];
  char buffer [33];
  char32_t *ptr;
  bool upper_local;
  int num_digits_local;
  unsigned___int128 value_local;
  back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> out_local;
  
  tVar1 = to_unsigned<int>(in_ECX);
  this = (detail *)to_pointer<char32_t>((buffer_appender<char32_t>)out.container,(ulong)tVar1);
  num_digits_00 = (int)CONCAT71(in_register_00000011,upper);
  if (this == (detail *)0x0) {
    value_01._8_8_ = in_stack_ffffffffffffff50;
    value_01._0_8_ = in_stack_ffffffffffffff48;
    format_uint<4u,char,unsigned__int128>
              (local_98,(char *)CONCAT44(in_register_00000034,num_digits),
               (unsigned___int128)value_01,num_digits_00,SUB41(in_ECX,0));
    out_local = copy_str_noinline<char32_t,char*,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>>
                          ((char *)local_98,(char *)(local_98 + in_ECX),out);
  }
  else {
    value_00._8_8_ = in_stack_ffffffffffffff50;
    value_00._0_8_ = in_stack_ffffffffffffff48;
    format_uint<4u,char32_t,unsigned__int128>
              (this,(char32_t *)CONCAT44(in_register_00000034,num_digits),
               (unsigned___int128)value_00,num_digits_00,SUB41(in_ECX,0));
    out_local.container = out.container;
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)out_local.container;
}

Assistant:

inline auto format_uint(It out, UInt value, int num_digits, bool upper = false)
    -> It {
  if (auto ptr = to_pointer<Char>(out, to_unsigned(num_digits))) {
    format_uint<BASE_BITS>(ptr, value, num_digits, upper);
    return out;
  }
  // Buffer should be large enough to hold all digits (digits / BASE_BITS + 1).
  char buffer[num_bits<UInt>() / BASE_BITS + 1];
  format_uint<BASE_BITS>(buffer, value, num_digits, upper);
  return detail::copy_str_noinline<Char>(buffer, buffer + num_digits, out);
}